

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O0

Result<result_tests::NoCopy> * result_tests::NoCopyFn(int i,bool success)

{
  byte in_DL;
  Result<result_tests::NoCopy> *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  Error *in_stack_ffffffffffffff40;
  Result<result_tests::NoCopy> *in_stack_ffffffffffffff48;
  Result<result_tests::NoCopy> *this;
  char *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  Result<result_tests::NoCopy> local_68;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_DL & 1) == 0) {
    this = &local_68;
    tinyformat::format<int>(in_stack_ffffffffffffff68,(int *)in_RDI);
    Untranslated(in_stack_ffffffffffffff70);
    util::Result<result_tests::NoCopy>::Result(this,in_stack_ffffffffffffff40);
    util::Error::~Error((Error *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  else {
    NoCopy::NoCopy((NoCopy *)0x971264,in_stack_ffffffffffffff3c);
    util::Result<result_tests::NoCopy>::Result
              (in_stack_ffffffffffffff48,(T *)in_stack_ffffffffffffff40);
    NoCopy::~NoCopy((NoCopy *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<NoCopy> NoCopyFn(int i, bool success)
{
    if (success) return {i};
    return util::Error{Untranslated(strprintf("nocopy %i error.", i))};
}